

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkStartFromNoLatches(Abc_Ntk_t *pNtk,Abc_NtkType_t Type,Abc_NtkFunc_t Func)

{
  Abc_Ntk_t *pNtk_00;
  char *pcVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  else {
    if (Type == ABC_NTK_NETLIST) {
      __assert_fail("Type != ABC_NTK_NETLIST",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0x106,
                    "Abc_Ntk_t *Abc_NtkStartFromNoLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t)"
                   );
    }
    pNtk_00 = Abc_NtkAlloc(Type,Func,1);
    iVar5 = pNtk->nBarBufs;
    pNtk_00->nConstrs = pNtk->nConstrs;
    pNtk_00->nBarBufs = iVar5;
    pcVar1 = Extra_UtilStrsav(pNtk->pName);
    pNtk_00->pName = pcVar1;
    pcVar1 = Extra_UtilStrsav(pNtk->pSpec);
    pNtk_00->pSpec = pcVar1;
    Abc_NtkCleanCopy(pNtk);
    if ((pNtk->ntkType == ABC_NTK_STRASH) && (pNtk_00->ntkType == ABC_NTK_STRASH)) {
      pAVar2 = Abc_AigConst1(pNtk_00);
      pAVar3 = Abc_AigConst1(pNtk);
      (pAVar3->field_6).pCopy = pAVar2;
    }
    for (iVar5 = 0; iVar5 < pNtk->vPis->nSize; iVar5 = iVar5 + 1) {
      pAVar2 = Abc_NtkPi(pNtk,iVar5);
      Abc_NtkDupObj(pNtk_00,pAVar2,1);
    }
    for (iVar5 = 0; iVar5 < pNtk->vPos->nSize; iVar5 = iVar5 + 1) {
      pAVar2 = Abc_NtkPo(pNtk,iVar5);
      Abc_NtkDupObj(pNtk_00,pAVar2,1);
    }
    for (iVar5 = 0; iVar5 < pNtk->vBoxes->nSize; iVar5 = iVar5 + 1) {
      pAVar2 = Abc_NtkBox(pNtk,iVar5);
      if ((*(uint *)&pAVar2->field_0x14 & 0xf) != 8) {
        Abc_NtkDupBox(pNtk_00,pAVar2,1);
      }
    }
    if (pNtk->vObjPerm != (Vec_Int_t *)0x0) {
      pVVar4 = Vec_IntDup(pNtk->vObjPerm);
      pNtk_00->vObjPerm = pVVar4;
    }
    pNtk_00->AndGateDelay = pNtk->AndGateDelay;
    Abc_ManTimeDup(pNtk,pNtk_00);
    if (pNtk->vPis->nSize != pNtk_00->vPis->nSize) {
      __assert_fail("Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0x125,
                    "Abc_Ntk_t *Abc_NtkStartFromNoLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t)"
                   );
    }
    if (pNtk->vPos->nSize != pNtk_00->vPos->nSize) {
      __assert_fail("Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0x126,
                    "Abc_Ntk_t *Abc_NtkStartFromNoLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t)"
                   );
    }
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkStartFromNoLatches( Abc_Ntk_t * pNtk, Abc_NtkType_t Type, Abc_NtkFunc_t Func )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj;
    int i;
    if ( pNtk == NULL )
        return NULL;
    assert( Type != ABC_NTK_NETLIST );
    // start the network
    pNtkNew = Abc_NtkAlloc( Type, Func, 1 );
    pNtkNew->nConstrs   = pNtk->nConstrs;
    pNtkNew->nBarBufs   = pNtk->nBarBufs;
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // map the constant nodes
    if ( Abc_NtkIsStrash(pNtk) && Abc_NtkIsStrash(pNtkNew) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        if ( Abc_ObjIsLatch(pObj) )
            continue;
        Abc_NtkDupBox(pNtkNew, pObj, 1);
    }
    if ( pNtk->vObjPerm )
        pNtkNew->vObjPerm = Vec_IntDup( pNtk->vObjPerm );
    pNtkNew->AndGateDelay = pNtk->AndGateDelay;
    // transfer the names
//    Abc_NtkTrasferNamesNoLatches( pNtk, pNtkNew );
    Abc_ManTimeDup( pNtk, pNtkNew );
    // check that the CI/CO/latches are copied correctly
    assert( Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew) );
    assert( Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkNew) );
    return pNtkNew;
}